

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_property.c
# Opt level: O0

int mpt_text_set(mpt_text *tx,char *name,mpt_convertable *src)

{
  int iVar1;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  mpt_text *local_60;
  mpt_text *pmStack_48;
  int type_1;
  mpt_text *from_1;
  mpt_text *pmStack_38;
  int type;
  mpt_text *from;
  mpt_convertable *pmStack_28;
  int len;
  mpt_convertable *src_local;
  char *name_local;
  mpt_text *tx_local;
  
  pmStack_28 = src;
  src_local = (mpt_convertable *)name;
  name_local = (char *)tx;
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      tx_local._4_4_ = -4;
    }
    else {
      from_1._4_4_ = mpt_text_pointer_typeid();
      if ((from_1._4_4_ < 1) ||
         (from._4_4_ = (*pmStack_28->_vptr->convert)
                                 (pmStack_28,(long)from_1._4_4_,&stack0xffffffffffffffc8),
         from._4_4_ < 0)) {
        from._4_4_ = mpt_string_pset((char **)name_local,pmStack_28);
        tx_local._4_4_ = from._4_4_;
        if (from._4_4_ < 0) {
          from_1._4_4_ = mpt_color_typeid();
          if ((from_1._4_4_ < 1) ||
             (iVar1 = (*pmStack_28->_vptr->convert)(pmStack_28,(long)from_1._4_4_,name_local + 0x10)
             , iVar1 < 0)) {
            tx_local._4_4_ = -3;
          }
          else {
            if (iVar1 == 0) {
              name_local[0x10] = -1;
              name_local[0x11] = '\0';
              name_local[0x12] = '\0';
              name_local[0x13] = '\0';
            }
            tx_local._4_4_ = 0;
          }
        }
      }
      else {
        mpt_text_fini((mpt_text *)name_local);
        if (from._4_4_ == 0) {
          local_60 = (mpt_text *)0x0;
        }
        else {
          local_60 = pmStack_38;
        }
        mpt_text_init((mpt_text *)name_local,local_60);
        tx_local._4_4_ = 0;
      }
    }
  }
  else if (*name == '\0') {
    if (src == (mpt_convertable *)0x0) {
      mpt_text_fini(tx);
      tx_local._4_4_ = 0;
    }
    else {
      iVar1 = mpt_text_pointer_typeid();
      if ((iVar1 < 1) ||
         (from._4_4_ = (*pmStack_28->_vptr->convert)
                                 (pmStack_28,(long)iVar1,&stack0xffffffffffffffb8), from._4_4_ < 0))
      {
        tx_local._4_4_ = -3;
      }
      else {
        mpt_text_fini((mpt_text *)name_local);
        mpt_text_init((mpt_text *)name_local,pmStack_48);
        tx_local._4_4_ = 0;
      }
    }
  }
  else {
    iVar1 = strcasecmp(name,"value");
    if (iVar1 == 0) {
      if (pmStack_28 == (mpt_convertable *)0x0) {
        mpt_string_set((char **)name_local,(char *)0x0,0);
        tx_local._4_4_ = 0;
      }
      else {
        tx_local._4_4_ = mpt_string_pset((char **)name_local,pmStack_28);
      }
    }
    else {
      iVar1 = strcasecmp((char *)src_local,"font");
      if (iVar1 == 0) {
        if (pmStack_28 == (mpt_convertable *)0x0) {
          mpt_string_set((char **)(name_local + 8),(char *)0x0,0);
          tx_local._4_4_ = 0;
        }
        else {
          tx_local._4_4_ = mpt_string_pset((char **)(name_local + 8),pmStack_28);
        }
      }
      else {
        iVar1 = strcasecmp((char *)src_local,"x");
        if (iVar1 == 0) {
          if ((pmStack_28 == (mpt_convertable *)0x0) ||
             (local_64 = (*pmStack_28->_vptr->convert)(pmStack_28,0x66,name_local + 0x18),
             local_64 == 0)) {
            name_local[0x18] = '\0';
            name_local[0x19] = '\0';
            name_local[0x1a] = '\0';
            name_local[0x1b] = '?';
            tx_local._4_4_ = 0;
          }
          else {
            if (-1 < local_64) {
              local_64 = 0;
            }
            tx_local._4_4_ = local_64;
          }
        }
        else {
          iVar1 = strcasecmp((char *)src_local,"y");
          if (iVar1 == 0) {
            if ((pmStack_28 == (mpt_convertable *)0x0) ||
               (local_68 = (*pmStack_28->_vptr->convert)(pmStack_28,0x66,name_local + 0x1c),
               local_68 == 0)) {
              name_local[0x1c] = '\0';
              name_local[0x1d] = '\0';
              name_local[0x1e] = '\0';
              name_local[0x1f] = '?';
              tx_local._4_4_ = 0;
            }
            else {
              if (-1 < local_68) {
                local_68 = 0;
              }
              tx_local._4_4_ = local_68;
            }
          }
          else {
            iVar1 = strcasecmp((char *)src_local,"pos");
            if (iVar1 == 0) {
              if ((pmStack_28 == (mpt_convertable *)0x0) ||
                 (local_6c = mpt_fpoint_set((mpt_fpoint *)(name_local + 0x18),pmStack_28,
                                            &mpt_text_set::r), local_6c == 0)) {
                ((mpt_fpoint *)(name_local + 0x18))->x = 0.5;
                ((mpt_fpoint *)(name_local + 0x18))->y = 0.5;
                tx_local._4_4_ = 0;
              }
              else {
                if (-1 < local_6c) {
                  local_6c = 0;
                }
                tx_local._4_4_ = local_6c;
              }
            }
            else {
              iVar1 = strcasecmp((char *)src_local,"color");
              if (iVar1 == 0) {
                tx_local._4_4_ = mpt_color_pset((mpt_color *)(name_local + 0x10),pmStack_28);
              }
              else {
                iVar1 = strcasecmp((char *)src_local,"size");
                if (iVar1 == 0) {
                  if ((pmStack_28 == (mpt_convertable *)0x0) ||
                     (local_70 = (*pmStack_28->_vptr->convert)(pmStack_28,0x79,name_local + 0x14),
                     local_70 == 0)) {
                    name_local[0x14] = '\n';
                    tx_local._4_4_ = 0;
                  }
                  else {
                    if (-1 < local_70) {
                      local_70 = 0;
                    }
                    tx_local._4_4_ = local_70;
                  }
                }
                else {
                  iVar1 = strcasecmp((char *)src_local,"align");
                  if (iVar1 == 0) {
                    if ((pmStack_28 == (mpt_convertable *)0x0) ||
                       (local_74 = (*pmStack_28->_vptr->convert)(pmStack_28,99,name_local + 0x17),
                       local_74 == 0)) {
                      name_local[0x17] = '5';
                      tx_local._4_4_ = 0;
                    }
                    else {
                      if (-1 < local_74) {
                        local_74 = 0;
                      }
                      tx_local._4_4_ = local_74;
                    }
                  }
                  else {
                    iVar1 = strcasecmp((char *)src_local,"angle");
                    if (iVar1 == 0) {
                      if ((pmStack_28 == (mpt_convertable *)0x0) ||
                         (local_78 = (*pmStack_28->_vptr->convert)(pmStack_28,100,name_local + 0x20)
                         , local_78 == 0)) {
                        *(double *)(name_local + 0x20) = 0.0;
                        tx_local._4_4_ = 0;
                      }
                      else {
                        if (-1 < local_78) {
                          local_78 = 0;
                        }
                        tx_local._4_4_ = local_78;
                      }
                    }
                    else {
                      tx_local._4_4_ = -1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return tx_local._4_4_;
}

Assistant:

extern int mpt_text_set(MPT_STRUCT(text) *tx, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		const MPT_STRUCT(text) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_text_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_text_fini(tx);
			mpt_text_init(tx, len ? from : 0);
			return 0;
		}
		if ((len = mpt_string_pset(&tx->_value, src)) >= 0) {
			return len;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &tx->color)) >= 0) {
			if (!len) tx->color = def_text.color;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(text) *from;
		int type;
		
		if (!src) {
			mpt_text_fini(tx);
			return 0;
		}
		if ((type = mpt_text_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_text_fini(tx);
			mpt_text_init(tx, from);
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* set properties */
	if (!strcasecmp(name, "value")) {
		if (!src) {
			mpt_string_set(&tx->_value, 0, 0);
			return 0;
		}
		return mpt_string_pset(&tx->_value, src);
	}
	if (!strcasecmp(name, "font")) {
		if (!src) {
			mpt_string_set(&tx->_font, 0, 0);
			return 0;
		}
		return mpt_string_pset(&tx->_font, src);
	}
	if (!strcasecmp(name, "x")) {
		if (!src || !(len = src->_vptr->convert(src, 'f', &tx->pos.x))) {
			tx->pos.x = def_text.pos.x;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "y")) {
		if (!src || !(len = src->_vptr->convert(src, 'f', &tx->pos.y))) {
			tx->pos.y = def_text.pos.y;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "pos")) {
		static const MPT_STRUCT(range) r = { 0.0, 1.0 };
		if (!src || !(len = mpt_fpoint_set(&tx->pos, src, &r))) {
			tx->pos = def_text.pos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "color")) {
		return mpt_color_pset(&tx->color, src);
	}
	if (!strcasecmp(name, "size")) {
		if (!src || !(len = src->_vptr->convert(src, 'y', &tx->size))) {
			tx->size = def_text.size;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "align")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &tx->align))) {
			tx->align = def_text.align;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "angle")) {
		if (!src || !(len = src->_vptr->convert(src, 'd', &tx->angle))) {
			tx->angle = def_text.angle;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	return MPT_ERROR(BadArgument);
}